

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createModuleTests(TestContext *testCtx)

{
  ShaderPermutation SVar1;
  TestCaseGroup *pTVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *testCodeFragments;
  InstanceContext *arg0;
  ShaderElement *local_e10;
  ShaderElement *local_de0;
  RGBA *local_c68;
  RGBA *local_c50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c48;
  InstanceContext local_c10;
  allocator<char> local_b29;
  string local_b28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b08;
  InstanceContext local_ad8;
  allocator<char> local_9f1;
  string local_9f0;
  undefined1 local_9ca;
  allocator<char> local_9c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  allocator<char> local_981;
  string local_980;
  allocator<char> local_959;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  allocator<char> local_911;
  string local_910;
  allocator<char> local_8e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  allocator<char> local_831;
  string local_830;
  allocator<char> local_809;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  ShaderElement *local_7a0;
  ShaderElement local_798;
  ShaderElement local_750;
  ShaderElement local_708;
  ShaderElement local_6c0;
  ShaderElement local_678;
  undefined1 auStack_630 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  undefined1 local_500 [8];
  string name;
  ShaderPermutation permutation;
  char *pcStack_4d8;
  deInt8 idx;
  char *numbers [2];
  InstanceContext local_490;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  undefined1 local_35a;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  ShaderElement *local_1d0;
  ShaderElement local_1c8;
  ShaderElement local_180;
  ShaderElement local_138;
  ShaderElement local_f0;
  ShaderElement local_a8;
  undefined1 auStack_60 [24];
  undefined1 local_48 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> moduleTests;
  RGBA invertedColors [4];
  RGBA defaultColors [4];
  TestContext *testCtx_local;
  
  local_c50 = invertedColors + 2;
  defaultColors._8_8_ = testCtx;
  do {
    tcu::RGBA::RGBA(local_c50);
    local_c50 = local_c50 + 1;
  } while (local_c50 != defaultColors + 2);
  local_c68 = (RGBA *)&moduleTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.field_0x8;
  do {
    tcu::RGBA::RGBA(local_c68);
    local_c68 = local_c68 + 1;
  } while (local_c68 != invertedColors + 2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)defaultColors._8_8_,"module","Multiple entry points into shaders"
            );
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)(auStack_60 + 0xb));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48,pTVar2
            );
  local_35a = 1;
  local_1d0 = &local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"module",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"main",&local_219);
  ShaderElement::ShaderElement(&local_1c8,&local_1f0,&local_218,VK_SHADER_STAGE_VERTEX_BIT);
  local_1d0 = &local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"module",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"main",&local_269);
  ShaderElement::ShaderElement(&local_180,&local_240,&local_268,VK_SHADER_STAGE_GEOMETRY_BIT);
  local_1d0 = &local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"module",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"main",&local_2b9);
  ShaderElement::ShaderElement
            (&local_138,&local_290,&local_2b8,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  local_1d0 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"module",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"main",&local_309);
  ShaderElement::ShaderElement
            (&local_f0,&local_2e0,&local_308,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  local_1d0 = &local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"module",&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"main",&local_359);
  testCodeFragments =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x10;
  ShaderElement::ShaderElement(&local_a8,&local_330,&local_358,VK_SHADER_STAGE_FRAGMENT_BIT);
  local_35a = 0;
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  getDefaultColors((RGBA (*) [4])(invertedColors + 2));
  getInvertedDefaultColors
            ((RGBA (*) [4])
             &moduleTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0x8);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"same_module",&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"",&local_3a9);
  numbers[1] = (char *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)(numbers + 1));
  createInstanceContext<5ul>
            (&local_490,(SpirVAssembly *)&local_1c8,(ShaderElement_0_ *)(numbers + 1),
             testCodeFragments);
  arg0 = &local_490;
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (pTVar2,&local_380,&local_3a8,createCombinedModule,runAndVerifyDefaultPipeline,arg0);
  InstanceContext::~InstanceContext(&local_490);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(numbers + 1));
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  pcStack_4d8 = "1";
  numbers[0] = "2";
  for (name.field_2._M_local_buf[0xf] = '\0'; name.field_2._M_local_buf[0xf] < ' ';
      name.field_2._M_local_buf[0xf] = name.field_2._M_local_buf[0xf] + '\x01') {
    SVar1 = getShaderPermutation(name.field_2._M_local_buf[0xf]);
    name.field_2._10_4_ = SVar1._0_4_;
    name.field_2._M_local_buf[0xe] = SVar1.fragmentPermutation;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_620,"vert",(allocator<char> *)(auStack_630 + 0xf));
    std::operator+(&local_600,&local_620,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[10] * 8));
    std::operator+(&local_5e0,&local_600,"_geom");
    std::operator+(&local_5c0,&local_5e0,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[0xb] * 8));
    std::operator+(&local_5a0,&local_5c0,"_tessc");
    std::operator+(&local_580,&local_5a0,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[0xc] * 8));
    std::operator+(&local_560,&local_580,"_tesse");
    std::operator+(&local_540,&local_560,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[0xd] * 8));
    std::operator+(&local_520,&local_540,"_frag");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500,
                   &local_520,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[0xe] * 8));
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator((allocator<char> *)(auStack_630 + 0xf));
    local_9ca = 1;
    local_7a0 = &local_798;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"vert",&local_7c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"vert",&local_809);
    std::operator+(&local_7e8,&local_808,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[10] * 8));
    ShaderElement::ShaderElement(&local_798,&local_7c0,&local_7e8,VK_SHADER_STAGE_VERTEX_BIT);
    local_7a0 = &local_750;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"geom",&local_831);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_878,"geom",&local_879);
    std::operator+(&local_858,&local_878,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[0xb] * 8));
    ShaderElement::ShaderElement(&local_750,&local_830,&local_858,VK_SHADER_STAGE_GEOMETRY_BIT);
    local_7a0 = &local_708;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"tessc",&local_8a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"tessc",&local_8e9);
    std::operator+(&local_8c8,&local_8e8,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[0xc] * 8));
    ShaderElement::ShaderElement
              (&local_708,&local_8a0,&local_8c8,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
    local_7a0 = &local_6c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"tesse",&local_911);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_958,"tesse",&local_959);
    std::operator+(&local_938,&local_958,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[0xd] * 8));
    ShaderElement::ShaderElement
              (&local_6c0,&local_910,&local_938,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
    local_7a0 = &local_678;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"frag",&local_981);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"frag",&local_9c9);
    std::operator+(&local_9a8,&local_9c8,
                   *(char **)((long)&stack0xfffffffffffffb28 +
                             (ulong)(byte)name.field_2._M_local_buf[0xe] * 8));
    ShaderElement::ShaderElement(&local_678,&local_980,&local_9a8,VK_SHADER_STAGE_FRAGMENT_BIT);
    local_9ca = 0;
    std::__cxx11::string::~string((string *)&local_9a8);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator(&local_9c9);
    std::__cxx11::string::~string((string *)&local_980);
    std::allocator<char>::~allocator(&local_981);
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::allocator<char>::~allocator(&local_959);
    std::__cxx11::string::~string((string *)&local_910);
    std::allocator<char>::~allocator(&local_911);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator(&local_8e9);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::allocator<char>::~allocator(&local_8a1);
    std::__cxx11::string::~string((string *)&local_858);
    std::__cxx11::string::~string((string *)&local_878);
    std::allocator<char>::~allocator(&local_879);
    std::__cxx11::string::~string((string *)&local_830);
    std::allocator<char>::~allocator(&local_831);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::~string((string *)&local_808);
    std::allocator<char>::~allocator(&local_809);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::allocator<char>::~allocator(&local_7c1);
    if (((name.field_2._10_4_ & 0xff) + ((uint)name.field_2._10_4_ >> 8 & 0xff) +
         ((uint)name.field_2._10_4_ >> 0x10 & 0xff) + ((uint)name.field_2._10_4_ >> 0x18) +
        (uint)(byte)name.field_2._M_local_buf[0xe]) % 2 == 0) {
      pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               ::get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                     local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,"",&local_9f1);
      local_b08._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_b08._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_b08._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_b08._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_b08._M_t._M_impl._0_8_ = 0;
      local_b08._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_b08._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&local_b08);
      createInstanceContext<5ul>
                (&local_ad8,(SpirVAssembly *)&local_798,(ShaderElement_0_ *)(invertedColors + 2),
                 (RGBA (*) [4])(invertedColors + 2),(RGBA (*) [4])&local_b08,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)arg0);
      arg0 = &local_ad8;
      addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                (pTVar2,(string *)local_500,&local_9f0,createMultipleEntries,
                 runAndVerifyDefaultPipeline,arg0);
      InstanceContext::~InstanceContext(&local_ad8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map(&local_b08);
      std::__cxx11::string::~string((string *)&local_9f0);
      std::allocator<char>::~allocator(&local_9f1);
    }
    else {
      pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               ::get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                     local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b28,"",&local_b29);
      local_c48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_c48._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c48._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_c48._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_c48._M_t._M_impl._0_8_ = 0;
      local_c48._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c48._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&local_c48);
      createInstanceContext<5ul>
                (&local_c10,(SpirVAssembly *)&local_798,(ShaderElement_0_ *)(invertedColors + 2),
                 (RGBA (*) [4])
                 &moduleTests.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8,(RGBA (*) [4])&local_c48,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)arg0);
      arg0 = &local_c10;
      addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                (pTVar2,(string *)local_500,&local_b28,createMultipleEntries,
                 runAndVerifyDefaultPipeline,arg0);
      InstanceContext::~InstanceContext(&local_c10);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map(&local_c48);
      std::__cxx11::string::~string((string *)&local_b28);
      std::allocator<char>::~allocator(&local_b29);
    }
    local_de0 = (ShaderElement *)auStack_630;
    do {
      local_de0 = local_de0 + -1;
      ShaderElement::~ShaderElement(local_de0);
    } while (local_de0 != &local_798);
    std::__cxx11::string::~string((string *)local_500);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48)
  ;
  local_e10 = (ShaderElement *)auStack_60;
  do {
    local_e10 = local_e10 + -1;
    ShaderElement::~ShaderElement(local_e10);
  } while (local_e10 != &local_1c8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createModuleTests(tcu::TestContext& testCtx)
{
	RGBA								defaultColors[4];
	RGBA								invertedColors[4];
	de::MovePtr<tcu::TestCaseGroup>		moduleTests			(new tcu::TestCaseGroup(testCtx, "module", "Multiple entry points into shaders"));

	const ShaderElement					combinedPipeline[]	=
	{
		ShaderElement("module", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_GEOMETRY_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_FRAGMENT_BIT)
	};

	getDefaultColors(defaultColors);
	getInvertedDefaultColors(invertedColors);
	addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), "same_module", "", createCombinedModule, runAndVerifyDefaultPipeline, createInstanceContext(combinedPipeline, map<string, string>()));

	const char* numbers[] =
	{
		"1", "2"
	};

	for (deInt8 idx = 0; idx < 32; ++idx)
	{
		ShaderPermutation			permutation		= getShaderPermutation(idx);
		string						name			= string("vert") + numbers[permutation.vertexPermutation] + "_geom" + numbers[permutation.geometryPermutation] + "_tessc" + numbers[permutation.tesscPermutation] + "_tesse" + numbers[permutation.tessePermutation] + "_frag" + numbers[permutation.fragmentPermutation];
		const ShaderElement			pipeline[]		=
		{
			ShaderElement("vert",	string("vert") +	numbers[permutation.vertexPermutation],		VK_SHADER_STAGE_VERTEX_BIT),
			ShaderElement("geom",	string("geom") +	numbers[permutation.geometryPermutation],	VK_SHADER_STAGE_GEOMETRY_BIT),
			ShaderElement("tessc",	string("tessc") +	numbers[permutation.tesscPermutation],		VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
			ShaderElement("tesse",	string("tesse") +	numbers[permutation.tessePermutation],		VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
			ShaderElement("frag",	string("frag") +	numbers[permutation.fragmentPermutation],	VK_SHADER_STAGE_FRAGMENT_BIT)
		};

		// If there are an even number of swaps, then it should be no-op.
		// If there are an odd number, the color should be flipped.
		if ((permutation.vertexPermutation + permutation.geometryPermutation + permutation.tesscPermutation + permutation.tessePermutation + permutation.fragmentPermutation) % 2 == 0)
		{
			addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), name, "", createMultipleEntries, runAndVerifyDefaultPipeline, createInstanceContext(pipeline, defaultColors, defaultColors, map<string, string>()));
		}
		else
		{
			addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), name, "", createMultipleEntries, runAndVerifyDefaultPipeline, createInstanceContext(pipeline, defaultColors, invertedColors, map<string, string>()));
		}
	}
	return moduleTests.release();
}